

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlwaysCombNonBlocking.cpp
# Opt level: O2

void __thiscall
always_comb_non_blocking::MainVisitor::handle(MainVisitor *this,ProceduralBlockSymbol *symbol)

{
  bool bVar1;
  string_view path;
  bool hasNonBlockingAssignment;
  char local_21;
  Result local_20;
  
  path = slang::SourceManager::getFileName
                   ((this->super_TidyVisitor).sourceManager.ptr,(symbol->super_Symbol).location);
  bVar1 = TidyVisitor::skip(&this->super_TidyVisitor,path);
  if ((!bVar1) && (symbol->procedureKind == AlwaysComb)) {
    local_20.super_anon_class_8_1_05aec793.hasNonBlockingAssignment =
         (anon_class_8_1_05aec793)&local_21;
    local_21 = '\0';
    slang::ast::ProceduralBlockSymbol::
    visitStmts<slang::ast::makeVisitor<always_comb_non_blocking::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1&,slang::ast::AssignmentExpression_const&)_1_>(always_comb_non_blocking::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1&,slang::ast::AssignmentExpression_const&)_1_)::Result>
              (symbol,&local_20);
    if (local_21 == '\x01') {
      slang::Diagnostics::add
                ((this->super_TidyVisitor).diags,(DiagCode)0x50010,(symbol->super_Symbol).location);
    }
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.procedureKind == ProceduralBlockKind::AlwaysComb) {
            bool hasNonBlockingAssignment = false;
            symbol.visitStmts(makeVisitor([&](auto&, const AssignmentExpression& expr) {
                if (expr.isNonBlocking()) {
                    hasNonBlockingAssignment = true;
                }
            }));
            if (hasNonBlockingAssignment) {
                diags.add(diag::AlwaysCombNonBlocking, symbol.location);
            }
        }
    }